

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

FT_Error T1_Set_MM_Blend(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  FT_Error error;
  FT_Fixed *coords_local;
  FT_UInt num_coords_local;
  T1_Face face_local;
  
  face_local._4_4_ = t1_set_mm_blend(face,num_coords,coords);
  if (face_local._4_4_ == 0) {
    if (num_coords == 0) {
      (face->root).face_flags = (face->root).face_flags & 0xffffffffffff7fff;
    }
    else {
      (face->root).face_flags = (face->root).face_flags | 0x8000;
    }
    face_local._4_4_ = 0;
  }
  return face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Set_MM_Blend( T1_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    FT_Error  error;


    error = t1_set_mm_blend( face, num_coords, coords );
    if ( error )
      return error;

    if ( num_coords )
      face->root.face_flags |= FT_FACE_FLAG_VARIATION;
    else
      face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

    return FT_Err_Ok;
  }